

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               *this,raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                     *that,allocator_type *a)

{
  allocator_type *paVar1;
  bool bVar2;
  ctrl_t *pcVar3;
  hasher *__elements_1;
  key_equal *__elements_2;
  allocator_type *paVar4;
  size_t *__a;
  size_t *__b;
  size_t n;
  iterator iVar5;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>::iterator,_bool>
  local_80;
  reference local_68;
  pair<const_int,_phmap::priv::(anonymous_namespace)::balast> *elem;
  iterator __end0;
  iterator __begin0;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *__range4;
  int local_24;
  allocator_type *local_20;
  allocator_type *a_local;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *that_local;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *this_local;
  
  local_20 = a;
  a_local = (allocator_type *)that;
  that_local = this;
  pcVar3 = EmptyGroup<std::is_same<std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>>
                     ();
  this->ctrl_ = pcVar3;
  this->slots_ = (slot_type *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  local_24 = 0;
  __elements_1 = hash_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                           *)a_local);
  __elements_2 = eq_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                         *)a_local);
  std::
  tuple<unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  ::
  tuple<int,_phmap::Hash<int>_&,_phmap::EqualTo<int>_&,_const_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_&,_true,_true>
            (&this->settings_,&local_24,__elements_1,__elements_2,local_20);
  paVar1 = local_20;
  paVar4 = alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                      *)a_local);
  bVar2 = std::operator==(paVar1,paVar4);
  if (bVar2) {
    std::swap<signed_char*>(&this->ctrl_,(char **)a_local);
    std::swap<phmap::priv::map_slot_type<int,phmap::priv::(anonymous_namespace)::balast>*>
              (&this->slots_,
               (map_slot_type<int,_phmap::priv::(anonymous_namespace)::balast> **)(a_local + 8));
    std::swap<unsigned_long>(&this->size_,(unsigned_long *)(a_local + 0x10));
    std::swap<unsigned_long>(&this->capacity_,(unsigned_long *)(a_local + 0x18));
    __a = growth_left(this);
    __b = growth_left((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                       *)a_local);
    std::swap<unsigned_long>(__a,__b);
    std::swap<phmap::priv::HashtablezInfoHandle>
              ((HashtablezInfoHandle *)&this->field_0x20,(HashtablezInfoHandle *)(a_local + 0x20));
  }
  else {
    n = size((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
              *)a_local);
    reserve(this,n);
    paVar1 = a_local;
    iVar5 = begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                   *)a_local);
    __end0.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)iVar5.ctrl_;
    iVar5 = end((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                 *)paVar1);
    while( true ) {
      __end0.ctrl_ = (ctrl_t *)iVar5.field_1;
      elem = (pair<const_int,_phmap::priv::(anonymous_namespace)::balast> *)iVar5.ctrl_;
      bVar2 = priv::operator!=((iterator *)&__end0.field_1,(iterator *)&elem);
      if (!bVar2) break;
      local_68 = iterator::operator*((iterator *)&__end0.field_1);
      insert<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>,_0,_0,_nullptr>
                (&local_80,this,
                 (pair<const_int,_phmap::priv::(anonymous_namespace)::balast> *)local_68);
      iterator::operator++((iterator *)&__end0.field_1);
      iVar5.field_1.slot_ = (slot_type *)__end0.ctrl_;
      iVar5.ctrl_ = (ctrl_t *)elem;
    }
  }
  return;
}

Assistant:

raw_hash_set(raw_hash_set&& that, const allocator_type& a)
        : ctrl_(EmptyGroup<std_alloc_t>()),
          slots_(nullptr),
          size_(0),
          capacity_(0),
          settings_(0, that.hash_ref(), that.eq_ref(), a) {
        if (a == that.alloc_ref()) {
            std::swap(ctrl_, that.ctrl_);
            std::swap(slots_, that.slots_);
            std::swap(size_, that.size_);
            std::swap(capacity_, that.capacity_);
            std::swap(growth_left(), that.growth_left());
            std::swap(infoz_, that.infoz_);
        } else {
            reserve(that.size());
            // Note: this will copy elements of dense_set and unordered_set instead of
            // moving them. This can be fixed if it ever becomes an issue.
            for (auto& elem : that) insert(std::move(elem));
        }
    }